

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GlobOpt.cpp
# Opt level: O2

void __thiscall GlobOpt::ProcessTryHandler(GlobOpt *this,Instr *instr)

{
  IRKind IVar1;
  code *pcVar2;
  bool bVar3;
  LabelInstr *pLVar4;
  undefined4 *puVar5;
  
  IVar1 = instr->m_next->m_kind;
  if ((IVar1 == InstrKindProfiledLabel) || (IVar1 == InstrKindLabel)) {
    pLVar4 = IR::Instr::AsLabelInstr(instr->m_next);
    if (pLVar4->m_region->type == RegionTypeTry) goto LAB_00426e3d;
  }
  AssertCount = AssertCount + 1;
  Js::Throw::LogAssert();
  puVar5 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
  *puVar5 = 1;
  bVar3 = Js::Throw::ReportAssert
                    ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/GlobOpt.cpp"
                     ,0x3f88,
                     "(instr->m_next->IsLabelInstr() && instr->m_next->AsLabelInstr()->GetRegion()->GetType() == RegionType::RegionTypeTry)"
                     ,
                     "instr->m_next->IsLabelInstr() && instr->m_next->AsLabelInstr()->GetRegion()->GetType() == RegionType::RegionTypeTry"
                    );
  if (!bVar3) {
    pcVar2 = (code *)invalidInstructionException();
    (*pcVar2)();
  }
  *puVar5 = 0;
LAB_00426e3d:
  pLVar4 = IR::Instr::AsLabelInstr(instr->m_next);
  ToVar(this,pLVar4->m_region->writeThroughSymbolsSet,this->currentBlock,(Instr *)0x0);
  return;
}

Assistant:

void
GlobOpt::ProcessTryHandler(IR::Instr* instr)
{
    Assert(instr->m_next->IsLabelInstr() && instr->m_next->AsLabelInstr()->GetRegion()->GetType() == RegionType::RegionTypeTry);

    Region* tryRegion = instr->m_next->AsLabelInstr()->GetRegion();
    BVSparse<JitArenaAllocator> * writeThroughSymbolsSet = tryRegion->writeThroughSymbolsSet;

    ToVar(writeThroughSymbolsSet, this->currentBlock);
}